

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.h
# Opt level: O3

void __thiscall cfd::core::ConfidentialTxOut::~ConfidentialTxOut(ConfidentialTxOut *this)

{
  *(code **)this = cfd::core::operator>=;
  if (*(void **)(this + 0xe0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0xe0));
  }
  if (*(void **)(this + 200) != (void *)0x0) {
    operator_delete(*(void **)(this + 200));
  }
  *(undefined ***)(this + 0xa0) = &PTR__ConfidentialNonce_004e1260;
  if (*(void **)(this + 0xa8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0xa8));
  }
  *(undefined ***)(this + 0x78) = &PTR__ConfidentialValue_004e0f10;
  if (*(void **)(this + 0x80) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x80));
  }
  *(undefined ***)(this + 0x50) = &PTR__ConfidentialAssetId_004e1078;
  if (*(void **)(this + 0x58) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x58));
  }
  *(code **)this = cfd::core::TapBranch::GetBaseHash;
  Script::~Script((Script *)(this + 0x18));
  return;
}

Assistant:

virtual ~ConfidentialTxOut() {
    // do nothing
  }